

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::RgbaOutputFile::setYCRounding(RgbaOutputFile *this,uint roundY,uint roundC)

{
  pthread_mutex_t *__mutex;
  ToYca *pTVar1;
  lock_guard<std::mutex> lock;
  
  __mutex = (pthread_mutex_t *)this->_toYca;
  if (__mutex != (pthread_mutex_t *)0x0) {
    std::mutex::lock((mutex *)&__mutex->__data);
    pTVar1 = this->_toYca;
    pTVar1->_roundY = roundY;
    pTVar1->_roundC = roundC;
    pthread_mutex_unlock(__mutex);
    return;
  }
  return;
}

Assistant:

void
RgbaOutputFile::setYCRounding (unsigned int roundY, unsigned int roundC)
{
    if (_toYca)
    {
        std::lock_guard<std::mutex> lock (*_toYca);
        _toYca->setYCRounding (roundY, roundC);
    }
}